

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uint *this;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_290;
  const_iterator local_288;
  size_t local_270;
  size_t buffersize;
  State state;
  uchar *puStack_40;
  uint error;
  uchar *buffer;
  size_t sStack_30;
  LodePNGColorType colortype_local;
  size_t insize_local;
  uchar *in_local;
  uint *h_local;
  uint *w_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  puStack_40 = (uchar *)0x0;
  buffer._4_4_ = colortype;
  sStack_30 = insize;
  insize_local = (size_t)in;
  in_local = (uchar *)h;
  h_local = w;
  w_local = (uint *)out;
  state.super_LodePNGState._540_4_ =
       lodepng_decode_memory(&stack0xffffffffffffffc0,w,h,in,insize,colortype,bitdepth);
  if ((puStack_40 != (uchar *)0x0) && (state.super_LodePNGState._540_4_ == 0)) {
    State::State((State *)&buffersize);
    state.super_LodePNGState.encoder.text_compression = buffer._4_4_;
    state.super_LodePNGState.encoder._84_4_ = bitdepth;
    local_270 = lodepng_get_raw_size
                          (*h_local,*(uint *)in_local,
                           (LodePNGColorMode *)&state.super_LodePNGState.encoder.text_compression);
    this = w_local;
    local_290._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)w_local);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_288,&local_290);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,local_288,puStack_40,
               puStack_40 + local_270);
    State::~State((State *)&buffersize);
  }
  lodepng_free(puStack_40);
  return state.super_LodePNGState._540_4_;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
                size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
  if(buffer && !error) {
    State state;
    state.info_raw.colortype = colortype;
    state.info_raw.bitdepth = bitdepth;
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}